

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
                     field_0x20 + lVar2);
  plVar1[-0x2d] = 0x919908;
  plVar1[3] = 0x919a20;
  plVar1[-0x1c] = 0x919930;
  plVar1[-0x1a] = 0x919958;
  plVar1[-0x13] = 0x919980;
  plVar1[-0xd] = 0x9199a8;
  plVar1[-6] = 0x9199d0;
  plVar1[-4] = 0x9199f8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__00919a40);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),0x198);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}